

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O3

Status * __thiscall
draco::PointCloudDecoder::DecodeMetadata(Status *__return_storage_ptr__,PointCloudDecoder *this)

{
  PointCloud *pPVar1;
  GeometryMetadata *__ptr_00;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  GeometryMetadata *pGVar4;
  pointer *__ptr;
  MetadataDecoder metadata_decoder;
  GeometryMetadata *local_48;
  long *local_40;
  long local_38;
  long local_30 [2];
  MetadataDecoder local_20;
  
  pGVar4 = (GeometryMetadata *)operator_new(0x78);
  p_Var2 = (_Rb_tree_header *)((long)&(pGVar4->super_Metadata).entries_._M_t._M_impl + 8);
  (((_Rb_tree_header *)((long)&(pGVar4->super_Metadata).entries_._M_t._M_impl + 8))->_M_header).
  _M_color = _S_red;
  *(_Base_ptr *)((long)&(pGVar4->super_Metadata).entries_._M_t._M_impl + 0x10) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)((long)&(pGVar4->super_Metadata).entries_._M_t._M_impl + 0x18) = p_Var2;
  *(_Rb_tree_header **)((long)&(pGVar4->super_Metadata).entries_._M_t._M_impl + 0x20) = p_Var2;
  *(size_t *)((long)&(pGVar4->super_Metadata).entries_._M_t._M_impl + 0x28) = 0;
  p_Var2 = (_Rb_tree_header *)((long)&(pGVar4->super_Metadata).sub_metadatas_._M_t._M_impl + 8);
  (((_Rb_tree_header *)((long)&(pGVar4->super_Metadata).sub_metadatas_._M_t._M_impl + 8))->_M_header
  )._M_color = _S_red;
  *(_Base_ptr *)((long)&(pGVar4->super_Metadata).sub_metadatas_._M_t._M_impl + 0x10) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)((long)&(pGVar4->super_Metadata).sub_metadatas_._M_t._M_impl + 0x18) = p_Var2
  ;
  *(_Rb_tree_header **)((long)&(pGVar4->super_Metadata).sub_metadatas_._M_t._M_impl + 0x20) = p_Var2
  ;
  *(size_t *)((long)&(pGVar4->super_Metadata).sub_metadatas_._M_t._M_impl + 0x28) = 0;
  (pGVar4->att_metadatas_).
  super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pGVar4->att_metadatas_).
           super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pGVar4->att_metadatas_).
           super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  local_48 = pGVar4;
  MetadataDecoder::MetadataDecoder(&local_20);
  bVar3 = MetadataDecoder::DecodeGeometryMetadata(&local_20,this->buffer_,pGVar4);
  pGVar4 = local_48;
  if (bVar3) {
    pPVar1 = this->point_cloud_;
    local_48 = (GeometryMetadata *)0x0;
    __ptr_00 = (pPVar1->metadata_)._M_t.
               super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
               .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
    (pPVar1->metadata_)._M_t.
    super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>.
    _M_t.
    super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
    .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl = pGVar4;
    if (__ptr_00 != (GeometryMetadata *)0x0) {
      std::default_delete<draco::GeometryMetadata>::operator()
                ((default_delete<draco::GeometryMetadata> *)&pPVar1->metadata_,__ptr_00);
    }
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  }
  else {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Failed to decode metadata.","");
    __return_storage_ptr__->code_ = DRACO_ERROR;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_40,local_38 + (long)local_40);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  if (local_48 != (GeometryMetadata *)0x0) {
    std::default_delete<draco::GeometryMetadata>::operator()
              ((default_delete<draco::GeometryMetadata> *)&local_48,local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudDecoder::DecodeMetadata() {
  std::unique_ptr<GeometryMetadata> metadata =
      std::unique_ptr<GeometryMetadata>(new GeometryMetadata());
  MetadataDecoder metadata_decoder;
  if (!metadata_decoder.DecodeGeometryMetadata(buffer_, metadata.get())) {
    return Status(Status::DRACO_ERROR, "Failed to decode metadata.");
  }
  point_cloud_->AddMetadata(std::move(metadata));
  return OkStatus();
}